

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

type_caster<AbstractIsolineTracer<double>::stepping_variable,_void> *
pybind11::detail::load_type<AbstractIsolineTracer<double>::stepping_variable,void>
          (type_caster<AbstractIsolineTracer<double>::stepping_variable,_void> *conv,handle *handle)

{
  bool bVar1;
  runtime_error *this;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  handle local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)conv,(handle)handle->m_ptr,true);
  if (bVar1) {
    return conv;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_f0.m_ptr = (PyObject *)PyObject_Str(handle->m_ptr->ob_type);
  str::operator_cast_to_string(&local_a8,(str *)&local_f0);
  std::operator+(&local_68,"Unable to cast Python instance of type ",&local_a8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar3) {
    local_e8.field_2._M_allocated_capacity = *psVar3;
    local_e8.field_2._8_8_ = plVar2[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar3;
  }
  local_e8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  type_id<AbstractIsolineTracer<double>::stepping_variable>();
  std::operator+(&local_48,&local_e8,&local_88);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_c8 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_c8 == plVar4) {
    local_b8 = *plVar4;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar4;
  }
  local_c0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_c8);
  *(undefined ***)this = &PTR__runtime_error_001abe98;
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    if (!conv.load(handle, true)) {
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ type (compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type " +
            (std::string) str(handle.get_type()) + " to C++ type '" + type_id<T>() + "'");
#endif
    }
    return conv;
}